

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  char *ptr;
  ImGuiTable *pIVar1;
  int n;
  
  if ((ctx->Tables).Map.Data.Size != 0) {
    n = 0;
    do {
      pIVar1 = ImPool<ImGuiTable>::TryGetMapData(&ctx->Tables,n);
      if (pIVar1 != (ImGuiTable *)0x0) {
        pIVar1->SettingsOffset = -1;
      }
      n = n + 1;
    } while (n != (ctx->Tables).Map.Data.Size);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}